

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

IDiagObjectAddress * __thiscall
Js::RecyclableObjectWalker::FindPropertyAddress
          (RecyclableObjectWalker *this,PropertyId propertyId,bool *isConst)

{
  Type pDVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  Type *ppDVar6;
  Type *ppIVar7;
  undefined4 extraout_var;
  ArenaAllocator *alloc;
  RecyclableObjectAddress *this_00;
  List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_01;
  int iVar8;
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_02;
  
  (*(this->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase[1])();
  this_02 = this->pMembersList;
  if ((this_02 !=
       (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0) &&
     (0 < (this_02->
          super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
          ).count)) {
    iVar8 = 0;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      ppDVar6 = JsUtil::
                List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_02,iVar8);
      pDVar1 = *ppDVar6;
      if (pDVar1 == (Type)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                    ,0x93f,"(pair)","pair");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      if (pDVar1->propId == propertyId) {
        *isConst = (bool)((byte)pDVar1->flags & 1);
        alloc = GetArenaFromContext(this->scriptContext);
        this_00 = (RecyclableObjectAddress *)new<Memory::ArenaAllocator>(0x28,alloc,0x364470);
        RecyclableObjectAddress::RecyclableObjectAddress
                  (this_00,this->instance,propertyId,pDVar1->aVar,pDVar1->flags >> 1 & 1);
        return &this_00->super_IDiagObjectAddress;
      }
      iVar8 = iVar8 + 1;
      this_02 = this->pMembersList;
    } while (iVar8 < (this_02->
                     super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
                     ).count);
  }
  this_01 = this->fakeGroupObjectWalkerList;
  if ((this_01 !=
       (List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0) &&
     (0 < (this_01->
          super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
          ).count)) {
    iVar8 = 0;
    do {
      ppIVar7 = JsUtil::
                List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_01,iVar8);
      iVar4 = (*(*ppIVar7)->_vptr_IDiagObjectModelWalkerBase[3])(*ppIVar7,propertyId,isConst);
      if ((IDiagObjectAddress *)CONCAT44(extraout_var,iVar4) != (IDiagObjectAddress *)0x0) {
        return (IDiagObjectAddress *)CONCAT44(extraout_var,iVar4);
      }
      iVar8 = iVar8 + 1;
      this_01 = this->fakeGroupObjectWalkerList;
    } while (iVar8 < (this_01->
                     super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                     ).count);
  }
  return (IDiagObjectAddress *)0x0;
}

Assistant:

IDiagObjectAddress *RecyclableObjectWalker::FindPropertyAddress(PropertyId propertyId, bool& isConst)
    {
        GetChildrenCount(); // Ensure to populate members

        if (pMembersList != nullptr)
        {
            for (int i = 0; i < pMembersList->Count(); i++)
            {
                DebuggerPropertyDisplayInfo *pair = pMembersList->Item(i);
                Assert(pair);
                if (pair->propId == propertyId)
                {
                    isConst = pair->IsConst();
                    return Anew(GetArenaFromContext(scriptContext),
                        RecyclableObjectAddress,
                        instance,
                        propertyId,
                        pair->aVar,
                        pair->IsInDeadZone() ? TRUE : FALSE);
                }
            }
        }

        // Following is for "with object" scope lookup. We may have members in [Methods] group or prototype chain that need to
        // be exposed to expression evaluation.
        if (fakeGroupObjectWalkerList != nullptr)
        {
            // WARNING: Following depends on [Methods] group being before [prototype] group. We need to check local [Methods] group
            // first for local properties before going to prototype chain.
            for (int i = 0; i < fakeGroupObjectWalkerList->Count(); i++)
            {
                IDiagObjectAddress* address = fakeGroupObjectWalkerList->Item(i)->FindPropertyAddress(propertyId, isConst);
                if (address != nullptr)
                {
                    return address;
                }
            }
        }

        return nullptr;
    }